

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

UINT32 calculateChecksum32(UINT32 *buffer,UINT32 bufferSize)

{
  UINT32 UVar1;
  ulong uVar2;
  
  UVar1 = 0;
  if (buffer != (UINT32 *)0x0) {
    if (3 < bufferSize) {
      uVar2 = 0;
      UVar1 = 0;
      do {
        UVar1 = UVar1 + buffer[uVar2];
        uVar2 = uVar2 + 1;
      } while (bufferSize >> 2 != uVar2);
    }
    UVar1 = -UVar1;
  }
  return UVar1;
}

Assistant:

UINT32 calculateChecksum32(const UINT32* buffer, UINT32 bufferSize)
{
    if (!buffer)
        return 0;
    
    UINT32 counter = 0;
    UINT32 index = 0;
    
    bufferSize /= sizeof(UINT32);
    
    for (; index < bufferSize; index++) {
        counter = (UINT32)(counter + buffer[index]);
    }
    
    return (UINT32)(0x100000000ULL - counter);
}